

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fIntegerStateQueryTests.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Functional::anon_unknown_2::SampleBuffersTestCase::test(SampleBuffersTestCase *this)

{
  ostringstream *this_00;
  bool bVar1;
  RenderTarget *pRVar2;
  undefined1 local_1a0 [384];
  
  pRVar2 = Context::getRenderTarget((this->super_ApiCase).super_TestCase.m_context);
  bVar1 = 1 < pRVar2->m_numSamples;
  local_1a0._0_8_ = (this->super_ApiCase).m_log;
  this_00 = (ostringstream *)(local_1a0 + 8);
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"Sample count is ",0x10);
  pRVar2 = Context::getRenderTarget((this->super_ApiCase).super_TestCase.m_context);
  std::ostream::operator<<(this_00,pRVar2->m_numSamples);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,", expecting GL_SAMPLE_BUFFERS to be ",0x24);
  std::ostream::operator<<(this_00,(uint)bVar1);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x78));
  (*this->m_verifier->_vptr_StateVerifier[2])
            (this->m_verifier,
             (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,0x80a8,
             (ulong)bVar1);
  ApiCase::expectError(&this->super_ApiCase,0);
  return;
}

Assistant:

void test (void)
	{
		const int expectedSampleBuffers = (m_context.getRenderTarget().getNumSamples() > 1) ? 1 : 0;

		m_log << tcu::TestLog::Message << "Sample count is " << (m_context.getRenderTarget().getNumSamples()) << ", expecting GL_SAMPLE_BUFFERS to be " << expectedSampleBuffers << tcu::TestLog::EndMessage;

		m_verifier->verifyInteger(m_testCtx, GL_SAMPLE_BUFFERS, expectedSampleBuffers);
		expectError(GL_NO_ERROR);
	}